

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * __thiscall re2::Compiler::Finish(Compiler *this)

{
  int iVar1;
  Prog *p;
  int64 m;
  Compiler *this_local;
  
  if ((this->failed_ & 1U) == 0) {
    iVar1 = Prog::start(this->prog_);
    if (iVar1 == 0) {
      iVar1 = Prog::start_unanchored(this->prog_);
      if (iVar1 == 0) {
        this->inst_len_ = 1;
      }
    }
    this->prog_->inst_ = this->inst_;
    this->prog_->size_ = this->inst_len_;
    this->inst_ = (Inst *)0x0;
    Prog::Optimize(this->prog_);
    Prog::Flatten(this->prog_);
    Prog::ComputeByteMap(this->prog_);
    if (this->max_mem_ < 1) {
      Prog::set_dfa_mem(this->prog_,0x100000);
    }
    else {
      p = (Prog *)(this->max_mem_ + -0x1b8 + (long)this->inst_len_ * -8);
      if ((long)p < 0) {
        p = (Prog *)0x0;
      }
      Prog::set_dfa_mem(this->prog_,(int64)p);
    }
    this_local = (Compiler *)this->prog_;
    this->prog_ = (Prog *)0x0;
  }
  else {
    this_local = (Compiler *)0x0;
  }
  return (Prog *)this_local;
}

Assistant:

Prog* Compiler::Finish() {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    inst_len_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = inst_;
  prog_->size_ = inst_len_;
  inst_ = NULL;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64 m = max_mem_ - sizeof(Prog) - inst_len_*sizeof(Prog::Inst);
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}